

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool appendToFile(string *filePath,string *text)

{
  byte bVar1;
  bool bVar2;
  string local_220 [8];
  ofstream file;
  string *text_local;
  string *filePath_local;
  
  std::ofstream::ofstream(local_220);
  std::operator|(_S_out,_S_app);
  std::ofstream::open(local_220,(_Ios_Openmode)filePath);
  bVar1 = std::ios::fail();
  bVar2 = (bVar1 & 1) == 0;
  if (bVar2) {
    std::operator<<((ostream *)local_220,(string *)text);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_220);
  return bVar2;
}

Assistant:

bool appendToFile(const std::string filePath, const std::string text)
{
    std::ofstream file;
    file.open(filePath, std::ios::out | std::ios::app);
    if (file.fail())
        return false;

    file << text;
    file.close();
    return true;
}